

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

void array_container_offset
               (array_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  ushort uVar1;
  array_container_t *paVar2;
  uint16_t *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  ushort uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  iVar4 = c->cardinality;
  if (iVar4 != 0) {
    if (iVar4 < 1) {
      uVar5 = 0xffffffff;
    }
    else {
      iVar7 = iVar4 + -1;
      uVar6 = 0;
      do {
        uVar5 = iVar7 + uVar6 >> 1;
        uVar9 = *(ushort *)((long)c->array + (ulong)(iVar7 + uVar6 & 0xfffffffe));
        if (uVar9 < (ushort)-offset) {
          uVar6 = uVar5 + 1;
        }
        else {
          if (uVar9 <= (ushort)-offset) goto LAB_00112494;
          iVar7 = uVar5 - 1;
        }
      } while ((int)uVar6 <= iVar7);
      uVar5 = ~uVar6;
    }
LAB_00112494:
    uVar6 = (int)uVar5 >> 0x1f ^ uVar5;
    if ((loc != (container_t **)0x0) && ((int)uVar5 >> 0x1f != uVar5)) {
      paVar2 = array_container_create_given_capacity(uVar6);
      if (0 < (int)uVar6) {
        iVar8 = paVar2->cardinality;
        uVar11 = 0;
        do {
          uVar9 = c->array[uVar11] + offset;
          if ((iVar8 == 0) ||
             ((puVar3 = paVar2->array, iVar8 != 0x7fffffff && (puVar3[(long)iVar8 + -1] < uVar9))))
          {
            if (iVar8 == paVar2->capacity) {
              array_container_grow(paVar2,iVar8 + 1,true);
              iVar8 = paVar2->cardinality;
            }
            paVar2->cardinality = iVar8 + 1;
            paVar2->array[iVar8] = uVar9;
            iVar4 = iVar8 + 1;
          }
          else {
            if (iVar8 < 1) {
              uVar13 = 0;
            }
            else {
              iVar4 = iVar8 + -1;
              uVar13 = 0;
              do {
                uVar10 = iVar4 + (int)uVar13;
                uVar5 = uVar10 >> 1;
                uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar10 & 0xfffffffe));
                if (uVar1 < uVar9) {
                  uVar13 = (ulong)(uVar5 + 1);
                }
                else {
                  iVar4 = iVar8;
                  if (uVar1 <= uVar9) goto LAB_001125de;
                  iVar4 = uVar5 - 1;
                }
              } while ((int)uVar13 <= iVar4);
              iVar4 = 0x7fffffff;
              if (iVar8 == 0x7fffffff) goto LAB_001125de;
            }
            if (iVar8 == paVar2->capacity) {
              array_container_grow(paVar2,iVar8 + 1,true);
              puVar3 = paVar2->array;
            }
            memmove(puVar3 + uVar13 + 1,puVar3 + uVar13,(long)(iVar8 - (int)uVar13) * 2);
            paVar2->array[uVar13] = uVar9;
            iVar4 = paVar2->cardinality + 1;
            paVar2->cardinality = iVar4;
          }
LAB_001125de:
          iVar8 = iVar4;
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar6);
      }
      *loc = paVar2;
      iVar4 = c->cardinality;
    }
    if ((hic != (container_t **)0x0) && (iVar4 - uVar6 != 0)) {
      paVar2 = array_container_create_given_capacity(iVar4 - uVar6);
      if ((int)uVar6 < c->cardinality) {
        lVar12 = (long)(int)uVar6;
        iVar8 = paVar2->cardinality;
        do {
          uVar9 = c->array[lVar12] + offset;
          if ((iVar8 == 0) ||
             ((puVar3 = paVar2->array, iVar8 != 0x7fffffff && (puVar3[(long)iVar8 + -1] < uVar9))))
          {
            if (iVar8 == paVar2->capacity) {
              array_container_grow(paVar2,iVar8 + 1,true);
              iVar8 = paVar2->cardinality;
            }
            paVar2->cardinality = iVar8 + 1;
            paVar2->array[iVar8] = uVar9;
            iVar4 = iVar8 + 1;
          }
          else {
            if (iVar8 < 1) {
              uVar11 = 0;
            }
            else {
              iVar4 = iVar8 + -1;
              uVar11 = 0;
              do {
                uVar6 = iVar4 + (int)uVar11;
                uVar5 = uVar6 >> 1;
                uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar6 & 0xfffffffe));
                if (uVar1 < uVar9) {
                  uVar11 = (ulong)(uVar5 + 1);
                }
                else {
                  iVar4 = iVar8;
                  if (uVar1 <= uVar9) goto LAB_0011271b;
                  iVar4 = uVar5 - 1;
                }
              } while ((int)uVar11 <= iVar4);
              iVar4 = 0x7fffffff;
              if (iVar8 == 0x7fffffff) goto LAB_0011271b;
            }
            if (iVar8 == paVar2->capacity) {
              array_container_grow(paVar2,iVar8 + 1,true);
              puVar3 = paVar2->array;
            }
            memmove(puVar3 + uVar11 + 1,puVar3 + uVar11,(long)(iVar8 - (int)uVar11) * 2);
            paVar2->array[uVar11] = uVar9;
            iVar4 = paVar2->cardinality + 1;
            paVar2->cardinality = iVar4;
          }
LAB_0011271b:
          iVar8 = iVar4;
          lVar12 = lVar12 + 1;
        } while (lVar12 < c->cardinality);
      }
      *hic = paVar2;
    }
  }
  return;
}

Assistant:

void array_container_offset(const array_container_t *c, container_t **loc,
                            container_t **hic, uint16_t offset) {
    array_container_t *lo = NULL, *hi = NULL;
    int top, lo_cap, hi_cap;

    top = (1 << 16) - offset;

    lo_cap = count_less(c->array, c->cardinality, top);
    if (loc && lo_cap) {
        lo = array_container_create_given_capacity(lo_cap);
        for (int i = 0; i < lo_cap; ++i) {
            array_container_add(lo, c->array[i] + offset);
        }
        *loc = (container_t *)lo;
    }

    hi_cap = c->cardinality - lo_cap;
    if (hic && hi_cap) {
        hi = array_container_create_given_capacity(hi_cap);
        for (int i = lo_cap; i < c->cardinality; ++i) {
            array_container_add(hi, c->array[i] + offset);
        }
        *hic = (container_t *)hi;
    }
}